

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdict.cpp
# Opt level: O0

void __thiscall CVmObjDict::CVmObjDict(CVmObjDict *this)

{
  int iVar1;
  CVmVarHeap *pCVar2;
  undefined4 extraout_var;
  vm_dict_ext *pvVar3;
  CVmObject *in_RDI;
  CVmObjDict *unaff_retaddr;
  CVmObject *pCVar4;
  vm_obj_id_t obj;
  
  pCVar4 = in_RDI;
  CVmObject::CVmObject(in_RDI);
  obj = (vm_obj_id_t)((ulong)pCVar4 >> 0x20);
  in_RDI->_vptr_CVmObject = (_func_int **)&PTR_get_metaclass_reg_003e2840;
  pCVar2 = CVmMemory::get_var_heap(G_mem_X);
  iVar1 = (*pCVar2->_vptr_CVmVarHeap[4])(pCVar2,0x40,in_RDI);
  in_RDI->ext_ = (char *)CONCAT44(extraout_var,iVar1);
  pvVar3 = get_ext((CVmObjDict *)in_RDI);
  pvVar3->image_data_ = (char *)0x0;
  pvVar3 = get_ext((CVmObjDict *)in_RDI);
  pvVar3->image_data_size_ = 0;
  pvVar3 = get_ext((CVmObjDict *)in_RDI);
  pvVar3->hashtab_ = (CVmHashTable *)0x0;
  pvVar3 = get_ext((CVmObjDict *)in_RDI);
  pvVar3->trie_ = (vmdict_TrieNode *)0x0;
  pvVar3 = get_ext((CVmObjDict *)in_RDI);
  pvVar3->modified_ = 0;
  pvVar3 = get_ext((CVmObjDict *)in_RDI);
  pvVar3->comparator_ = 0;
  set_comparator_type(unaff_retaddr,obj);
  return;
}

Assistant:

CVmObjDict::CVmObjDict(VMG0_)
{
    /* allocate our extension structure from the variable heap */
    ext_ = (char *)G_mem->get_var_heap()
           ->alloc_mem(sizeof(vm_dict_ext), this);

    /* we have no image data yet */
    get_ext()->image_data_ = 0;
    get_ext()->image_data_size_ = 0;

    /* no hash table yet */
    get_ext()->hashtab_ = 0;

    /* no Trie yet */
    get_ext()->trie_ = 0;

    /* no non-image entries yet */
    get_ext()->modified_ = FALSE;

    /* no comparator yet */
    get_ext()->comparator_ = VM_INVALID_OBJ;
    set_comparator_type(vmg_ VM_INVALID_OBJ);
}